

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  pointer ppFVar1;
  bool bVar2;
  int file_descriptor;
  Type *proto;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  bool bVar7;
  int i;
  ulong uVar8;
  FileOutputStream out;
  FileDescriptorSet file_set;
  
  FileDescriptorSet::FileDescriptorSet(&file_set);
  if (this->imports_in_descriptor_set_ == false) {
    for (uVar8 = 0;
        uVar8 < (ulong)((long)(parsed_files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(parsed_files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
      proto = internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                        (&file_set.file_.super_RepeatedPtrFieldBase);
      FileDescriptor::CopyTo
                ((parsed_files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar8],proto);
      if (this->source_info_in_descriptor_set_ == true) {
        FileDescriptor::CopySourceCodeInfoTo
                  ((parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar8],proto);
      }
    }
  }
  else {
    out.copying_output_._16_8_ = &out.copying_output_;
    out.copying_output_.super_CopyingOutputStream._vptr_CopyingOutputStream._0_4_ = 0;
    out.copying_output_.file_ = 0;
    out.copying_output_.close_on_delete_ = false;
    out.copying_output_.is_closed_ = false;
    out.copying_output_._14_2_ = 0;
    out.impl_.copying_stream_ = (CopyingOutputStream *)0x0;
    out.impl_.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream =
         (_func_int **)out.copying_output_._16_8_;
    for (uVar8 = 0;
        ppFVar1 = (parsed_files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(parsed_files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
        uVar8 = uVar8 + 1) {
      GetTransitiveDependencies
                (ppFVar1[uVar8],this->source_info_in_descriptor_set_,
                 (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&out,&file_set.file_);
    }
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)&out);
  }
  psVar6 = &this->descriptor_set_name_;
  do {
    file_descriptor = open((psVar6->_M_dataplus)._M_p,0x241,0x1b6);
    if (-1 < file_descriptor) {
      io::FileOutputStream::FileOutputStream(&out,file_descriptor,-1);
      bVar2 = MessageLite::SerializeToZeroCopyStream
                        ((MessageLite *)&file_set,&out.super_ZeroCopyOutputStream);
      if (bVar2) {
        bVar2 = io::FileOutputStream::Close(&out);
        bVar7 = true;
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)psVar6);
          poVar4 = std::operator<<(poVar4,": ");
          pcVar5 = strerror(out.copying_output_.errno_);
          poVar4 = std::operator<<(poVar4,pcVar5);
          std::endl<char,std::char_traits<char>>(poVar4);
          goto LAB_001a3b1f;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)psVar6);
        poVar4 = std::operator<<(poVar4,": ");
        pcVar5 = strerror(out.copying_output_.errno_);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar4);
        io::FileOutputStream::Close(&out);
LAB_001a3b1f:
        bVar7 = false;
      }
      io::FileOutputStream::~FileOutputStream(&out);
      goto LAB_001a3b2b;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  perror((psVar6->_M_dataplus)._M_p);
  bVar7 = false;
LAB_001a3b2b:
  FileDescriptorSet::~FileDescriptorSet(&file_set);
  return bVar7;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const vector<const FileDescriptor*> parsed_files) {
  FileDescriptorSet file_set;

  if (imports_in_descriptor_set_) {
    set<const FileDescriptor*> already_seen;
    for (int i = 0; i < parsed_files.size(); i++) {
      GetTransitiveDependencies(parsed_files[i],
                                source_info_in_descriptor_set_,
                                &already_seen, file_set.mutable_file());
    }
  } else {
    for (int i = 0; i < parsed_files.size(); i++) {
      FileDescriptorProto* file_proto = file_set.add_file();
      parsed_files[i]->CopyTo(file_proto);
      if (source_info_in_descriptor_set_) {
        parsed_files[i]->CopySourceCodeInfoTo(file_proto);
      }
    }
  }

  int fd;
  do {
    fd = open(descriptor_set_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    return false;
  }

  return true;
}